

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O1

void Imf_3_4::Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(IStream *in,double *v)

{
  double in_RAX;
  uchar b [8];
  double local_18;
  
  local_18 = in_RAX;
  (*in->_vptr_IStream[3])(in,&local_18,8);
  *v = local_18;
  return;
}

Assistant:

void
read (T& in, double& v)
{
    unsigned char b[8];

    readUnsignedChars<S> (in, b, 8);

    union
    {
        uint64_t i;
        double   d;
    } u;

    u.i = ((uint64_t) b[0] & 0x00000000000000ffULL) |
          (((uint64_t) b[1] << 8) & 0x000000000000ff00ULL) |
          (((uint64_t) b[2] << 16) & 0x0000000000ff0000ULL) |
          (((uint64_t) b[3] << 24) & 0x00000000ff000000ULL) |
          (((uint64_t) b[4] << 32) & 0x000000ff00000000ULL) |
          (((uint64_t) b[5] << 40) & 0x0000ff0000000000ULL) |
          (((uint64_t) b[6] << 48) & 0x00ff000000000000ULL) |
          ((uint64_t) b[7] << 56);

    v = u.d;
}